

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutPt * __thiscall ClipperLib::Clipper::AddOutPt(Clipper *this,TEdge *e,IntPoint *pt)

{
  value_type pOVar1;
  Clipper *pCVar2;
  bool bVar3;
  OutRec *outrec;
  reference ppOVar4;
  bool bVar5;
  OutPt *newOp_1;
  bool ToFront;
  OutPt *op;
  OutRec *outRec_1;
  OutPt *newOp;
  OutRec *outRec;
  IntPoint *pt_local;
  TEdge *e_local;
  Clipper *this_local;
  
  if (e->OutIdx < 0) {
    outrec = ClipperBase::CreateOutRec
                       ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]))
    ;
    outrec->IsOpen = e->WindDelta == 0;
    this_local = (Clipper *)operator_new(0x28);
    OutPt::OutPt((OutPt *)this_local);
    outrec->Pts = (OutPt *)this_local;
    *(int *)&this_local->_vptr_Clipper = outrec->Idx;
    (this_local->m_Joins).
    super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pt->X;
    (this_local->m_Joins).
    super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pt->Y;
    (this_local->m_Joins).
    super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this_local;
    (this_local->m_GhostJoins).
    super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this_local;
    if ((outrec->IsOpen & 1U) == 0) {
      SetHoleState(this,e,outrec);
    }
    e->OutIdx = outrec->Idx;
  }
  else {
    ppOVar4 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                         ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),(long)e->OutIdx);
    pOVar1 = *ppOVar4;
    pCVar2 = (Clipper *)pOVar1->Pts;
    bVar5 = e->Side == esLeft;
    if ((!bVar5) ||
       (bVar3 = ClipperLib::operator==(pt,(IntPoint *)&pCVar2->m_Joins), this_local = pCVar2, !bVar3
       )) {
      if ((bVar5) ||
         (bVar3 = ClipperLib::operator==
                            (pt,&((OutPt *)
                                 (pCVar2->m_GhostJoins).
                                 super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->Pt), !bVar3)) {
        this_local = (Clipper *)operator_new(0x28);
        OutPt::OutPt((OutPt *)this_local);
        *(int *)&this_local->_vptr_Clipper = pOVar1->Idx;
        (this_local->m_Joins).
        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pt->X;
        (this_local->m_Joins).
        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pt->Y;
        (this_local->m_Joins).
        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pCVar2;
        (this_local->m_GhostJoins).
        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pCVar2->m_GhostJoins).
                      super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        ((OutPt *)
        (this_local->m_GhostJoins).
        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
        super__Vector_impl_data._M_start)->Next = (OutPt *)this_local;
        (pCVar2->m_GhostJoins).
        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this_local;
        if (bVar5) {
          pOVar1->Pts = (OutPt *)this_local;
        }
      }
      else {
        this_local = (Clipper *)
                     (pCVar2->m_GhostJoins).
                     super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  return (OutPt *)this_local;
}

Assistant:

OutPt* Clipper::AddOutPt(TEdge *e, const IntPoint &pt)
{
  if(  e->OutIdx < 0 )
  {
    OutRec *outRec = CreateOutRec();
    outRec->IsOpen = (e->WindDelta == 0);
    OutPt* newOp = new OutPt;
    outRec->Pts = newOp;
    newOp->Idx = outRec->Idx;
    newOp->Pt = pt;
    newOp->Next = newOp;
    newOp->Prev = newOp;
    if (!outRec->IsOpen)
      SetHoleState(e, outRec);
    e->OutIdx = outRec->Idx;
    return newOp;
  } else
  {
    OutRec *outRec = m_PolyOuts[e->OutIdx];
    //OutRec.Pts is the 'Left-most' point & OutRec.Pts.Prev is the 'Right-most'
    OutPt* op = outRec->Pts;

	bool ToFront = (e->Side == esLeft);
	if (ToFront && (pt == op->Pt)) return op;
    else if (!ToFront && (pt == op->Prev->Pt)) return op->Prev;

    OutPt* newOp = new OutPt;
    newOp->Idx = outRec->Idx;
    newOp->Pt = pt;
    newOp->Next = op;
    newOp->Prev = op->Prev;
    newOp->Prev->Next = newOp;
    op->Prev = newOp;
    if (ToFront) outRec->Pts = newOp;
    return newOp;
  }
}